

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UBool __thiscall icu_63::UnicodeSet::containsNone(UnicodeSet *this,UnicodeSet *c)

{
  uint uVar1;
  UChar32 *pUVar2;
  UChar32 *pUVar3;
  UBool UVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = c->len;
  if (1 < (int)uVar1) {
    pUVar2 = c->list;
    pUVar3 = this->list;
    uVar6 = 0;
    do {
      uVar5 = findCodePoint(this,pUVar2[uVar6 * 2]);
      if (((uVar5 & 1) != 0) || (pUVar3[(int)uVar5] < pUVar2[uVar6 * 2 + 1])) {
        return '\0';
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 >> 1 != uVar6);
  }
  UVar4 = UVector::containsNone(this->strings,c->strings);
  return UVar4 != '\0';
}

Assistant:

UBool UnicodeSet::containsNone(const UnicodeSet& c) const {
    // The specified set is a subset if all of its pairs are contained in
    // this set.  It's possible to code this more efficiently in terms of
    // direct manipulation of the inversion lists if the need arises.
    int32_t n = c.getRangeCount();
    for (int32_t i=0; i<n; ++i) {
        if (!containsNone(c.getRangeStart(i), c.getRangeEnd(i))) {
            return FALSE;
        }
    }
    if (!strings->containsNone(*c.strings)) return FALSE;
    return TRUE;
}